

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

string * __thiscall
absl::CEscape_abi_cxx11_(string *__return_storage_ptr__,absl *this,string_view src)

{
  absl *paVar1;
  absl aVar2;
  absl *paVar3;
  ulong uVar4;
  absl *paVar5;
  absl *paVar6;
  bool bVar7;
  string death_message;
  long *local_68 [2];
  long local_58 [2];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar4 = src._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  paVar3 = (absl *)0x3fffffffffffffff;
  if (this < (absl *)0x3fffffffffffffff) {
    paVar3 = this;
  }
  if (this == (absl *)0x0) {
    paVar3 = (absl *)0x0;
    paVar6 = (absl *)0x0;
  }
  else {
    paVar6 = (absl *)0x0;
    paVar5 = (absl *)0x0;
    do {
      paVar1 = paVar5 + uVar4;
      paVar5 = paVar5 + 1;
      paVar6 = paVar6 + (byte)(anonymous_namespace)::kCEscapedLen[(byte)*paVar1];
    } while (paVar3 != paVar5);
  }
  if (paVar3 < this) {
    do {
      bVar7 = CARRY8((ulong)(byte)(anonymous_namespace)::kCEscapedLen[(byte)paVar3[uVar4]],
                     (ulong)paVar6);
      paVar6 = paVar6 + (byte)(anonymous_namespace)::kCEscapedLen[(byte)paVar3[uVar4]];
      if (bVar7) {
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,
                   "Check escaped_len <= std::numeric_limits<size_t>::max() - char_len failed: ","")
        ;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"escaped_len overflow","");
        std::__cxx11::string::_M_append((char *)local_48,(ulong)local_68[0]);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
        (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                  (3,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/escaping.cc"
                   ,0x19a,local_48);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/escaping.cc"
                      ,0x19a,"size_t absl::(anonymous namespace)::CEscapedLength(absl::string_view)"
                     );
      }
      paVar3 = paVar3 + 1;
    } while (this != paVar3);
  }
  if (paVar6 == this) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,uVar4);
  }
  else {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)paVar6);
    if (this != (absl *)0x0) {
      paVar3 = (absl *)(__return_storage_ptr__->_M_dataplus)._M_p;
      paVar6 = (absl *)0x0;
      do {
        aVar2 = paVar6[uVar4];
        if ((anonymous_namespace)::kCEscapedLen[(byte)aVar2] == '\x02') {
          if ((byte)aVar2 < 0x22) {
            if (aVar2 == (absl)0x9) {
              *(undefined2 *)paVar3 = 0x745c;
            }
            else if (aVar2 == (absl)0xa) {
              *(undefined2 *)paVar3 = 0x6e5c;
            }
            else {
              if (aVar2 != (absl)0xd) goto LAB_002610c7;
              *(undefined2 *)paVar3 = 0x725c;
            }
          }
          else if (aVar2 == (absl)0x22) {
            *(undefined2 *)paVar3 = 0x225c;
          }
          else if (aVar2 == (absl)0x27) {
            *(undefined2 *)paVar3 = 0x275c;
          }
          else {
            if (aVar2 != (absl)0x5c) goto LAB_002610c7;
            *(undefined2 *)paVar3 = 0x5c5c;
          }
          paVar3 = paVar3 + 2;
        }
        else if ((anonymous_namespace)::kCEscapedLen[(byte)aVar2] == '\x01') {
          *paVar3 = aVar2;
          paVar3 = paVar3 + 1;
        }
        else {
          *paVar3 = (absl)0x5c;
          paVar3[1] = (absl)((byte)aVar2 >> 6 | 0x30);
          paVar3[2] = (absl)((byte)aVar2 >> 3 & 7 | 0x30);
          paVar3[3] = (absl)((byte)aVar2 & 7 | 0x30);
          paVar3 = paVar3 + 4;
        }
LAB_002610c7:
        paVar6 = paVar6 + 1;
      } while (this != paVar6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CEscape(absl::string_view src) {
  std::string dest;
  CEscapeAndAppendInternal(src, &dest);
  return dest;
}